

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void HFilter16i_SSE2(uint8_t *p,int stride,int thresh,int ithresh,int hev_thresh)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long in_RDI;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  undefined1 auVar20 [16];
  byte bVar33;
  undefined1 auVar21 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint8_t *b;
  __m128i tmp2;
  __m128i tmp1;
  __m128i mask;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i p3;
  int k;
  undefined8 local_378;
  __m128i *in_stack_fffffffffffffc90;
  __m128i *in_stack_fffffffffffffc98;
  __m128i *in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  uint8_t *in_stack_fffffffffffffcb0;
  uint8_t *in_stack_fffffffffffffcb8;
  __m128i *in_stack_fffffffffffffcc0;
  __m128i *in_stack_fffffffffffffcc8;
  __m128i *in_stack_fffffffffffffcd0;
  __m128i *in_stack_fffffffffffffcd8;
  __m128i *in_stack_fffffffffffffce0;
  __m128i *in_stack_fffffffffffffce8;
  undefined8 uStack_310;
  undefined4 local_304;
  undefined1 in_stack_fffffffffffffd48 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  int stride_00;
  undefined4 uStack_1fc;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_24;
  undefined1 uStack_23;
  undefined1 uStack_22;
  undefined1 uStack_21;
  undefined1 uStack_20;
  undefined1 uStack_1f;
  undefined1 uStack_1e;
  undefined1 uStack_1d;
  undefined1 uStack_1c;
  undefined1 uStack_1b;
  undefined1 uStack_1a;
  undefined1 uStack_19;
  undefined1 uStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  Load16x4_SSE2(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                (int)((ulong)in_stack_fffffffffffffca8 >> 0x20),in_stack_fffffffffffffca0,
                in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffd48._8_8_)
  ;
  for (local_304 = 3; 0 < local_304; local_304 = local_304 + -1) {
    in_RDI = in_RDI + 4;
    auVar19._8_8_ = in_stack_fffffffffffffcc0;
    auVar19._0_8_ = in_stack_fffffffffffffcb8;
    auVar18._8_8_ = in_stack_fffffffffffffcd0;
    auVar18._0_8_ = in_stack_fffffffffffffcc8;
    auVar34 = psubusb(auVar19,auVar18);
    auVar17._8_8_ = in_stack_fffffffffffffcd0;
    auVar17._0_8_ = in_stack_fffffffffffffcc8;
    auVar16._8_8_ = in_stack_fffffffffffffcc0;
    auVar16._0_8_ = in_stack_fffffffffffffcb8;
    auVar20 = psubusb(auVar17,auVar16);
    local_238 = auVar34._0_8_;
    uStack_230 = auVar34._8_8_;
    local_248 = auVar20._0_8_;
    uStack_240 = auVar20._8_8_;
    local_238 = local_238 | local_248;
    uStack_230 = uStack_230 | uStack_240;
    auVar15._8_8_ = in_stack_fffffffffffffce0;
    auVar15._0_8_ = in_stack_fffffffffffffcd8;
    auVar14._8_8_ = uStack_310;
    auVar14._0_8_ = in_stack_fffffffffffffce8;
    auVar34 = psubusb(auVar15,auVar14);
    auVar13._8_8_ = uStack_310;
    auVar13._0_8_ = in_stack_fffffffffffffce8;
    auVar12._8_8_ = in_stack_fffffffffffffce0;
    auVar12._0_8_ = in_stack_fffffffffffffcd8;
    auVar20 = psubusb(auVar13,auVar12);
    local_258 = auVar34._0_8_;
    uStack_250 = auVar34._8_8_;
    local_268 = auVar20._0_8_;
    uStack_260 = auVar20._8_8_;
    local_258 = local_258 | local_268;
    uStack_250 = uStack_250 | uStack_260;
    uStack_14 = (byte)(local_238 >> 0x20);
    uStack_13 = (byte)(local_238 >> 0x28);
    uStack_12 = (byte)(local_238 >> 0x30);
    uStack_11 = (byte)(local_238 >> 0x38);
    uStack_10 = (byte)uStack_230;
    uStack_f = (byte)(uStack_230 >> 8);
    uStack_e = (byte)(uStack_230 >> 0x10);
    uStack_d = (byte)(uStack_230 >> 0x18);
    uStack_c = (byte)(uStack_230 >> 0x20);
    uStack_b = (byte)(uStack_230 >> 0x28);
    uStack_a = (byte)(uStack_230 >> 0x30);
    uStack_9 = (byte)(uStack_230 >> 0x38);
    uStack_24 = (byte)(local_258 >> 0x20);
    uStack_23 = (byte)(local_258 >> 0x28);
    uStack_22 = (byte)(local_258 >> 0x30);
    uStack_21 = (byte)(local_258 >> 0x38);
    uStack_20 = (byte)uStack_250;
    uStack_1f = (byte)(uStack_250 >> 8);
    uStack_1e = (byte)(uStack_250 >> 0x10);
    uStack_1d = (byte)(uStack_250 >> 0x18);
    uStack_1c = (byte)(uStack_250 >> 0x20);
    uStack_1b = (byte)(uStack_250 >> 0x28);
    uStack_1a = (byte)(uStack_250 >> 0x30);
    uStack_19 = (byte)(uStack_250 >> 0x38);
    bVar22 = (uStack_14 < uStack_24) * uStack_24 | (uStack_14 >= uStack_24) * uStack_14;
    bVar23 = (uStack_13 < uStack_23) * uStack_23 | (uStack_13 >= uStack_23) * uStack_13;
    bVar24 = (uStack_12 < uStack_22) * uStack_22 | (uStack_12 >= uStack_22) * uStack_12;
    bVar25 = (uStack_11 < uStack_21) * uStack_21 | (uStack_11 >= uStack_21) * uStack_11;
    bVar26 = (uStack_10 < uStack_20) * uStack_20 | (uStack_10 >= uStack_20) * uStack_10;
    bVar27 = (uStack_f < uStack_1f) * uStack_1f | (uStack_f >= uStack_1f) * uStack_f;
    bVar28 = (uStack_e < uStack_1e) * uStack_1e | (uStack_e >= uStack_1e) * uStack_e;
    bVar29 = (uStack_d < uStack_1d) * uStack_1d | (uStack_d >= uStack_1d) * uStack_d;
    bVar30 = (uStack_c < uStack_1c) * uStack_1c | (uStack_c >= uStack_1c) * uStack_c;
    bVar31 = (uStack_b < uStack_1b) * uStack_1b | (uStack_b >= uStack_1b) * uStack_b;
    bVar32 = (uStack_a < uStack_1a) * uStack_1a | (uStack_a >= uStack_1a) * uStack_a;
    bVar33 = (uStack_9 < uStack_19) * uStack_19 | (uStack_9 >= uStack_19) * uStack_9;
    auVar11._8_8_ = in_stack_fffffffffffffcd0;
    auVar11._0_8_ = in_stack_fffffffffffffcc8;
    auVar35._8_8_ = in_stack_fffffffffffffce0;
    auVar35._0_8_ = in_stack_fffffffffffffcd8;
    auVar35 = psubusb(auVar11,auVar35);
    auVar10._8_8_ = in_stack_fffffffffffffce0;
    auVar10._0_8_ = in_stack_fffffffffffffcd8;
    auVar9._8_8_ = in_stack_fffffffffffffcd0;
    auVar9._0_8_ = in_stack_fffffffffffffcc8;
    auVar20 = psubusb(auVar10,auVar9);
    local_278 = auVar35._0_8_;
    local_288 = auVar20._0_8_;
    uStack_280 = auVar20._8_8_;
    local_278 = local_278 | local_288;
    uStack_280 = (ulong)auVar35._8_8_ | uStack_280;
    uStack_44 = (byte)(local_278 >> 0x20);
    uStack_43 = (byte)(local_278 >> 0x28);
    uStack_42 = (byte)(local_278 >> 0x30);
    uStack_41 = (byte)(local_278 >> 0x38);
    uStack_40 = (byte)uStack_280;
    uStack_3f = (byte)(uStack_280 >> 8);
    uStack_3e = (byte)(uStack_280 >> 0x10);
    uStack_3d = (byte)(uStack_280 >> 0x18);
    uStack_3c = (byte)(uStack_280 >> 0x20);
    uStack_3b = (byte)(uStack_280 >> 0x28);
    uStack_3a = (byte)(uStack_280 >> 0x30);
    uStack_39 = (byte)(uStack_280 >> 0x38);
    Load16x4_SSE2(in_stack_fffffffffffffcb8,
                  (uint8_t *)
                  CONCAT17((bVar33 < uStack_39) * uStack_39 | (bVar33 >= uStack_39) * bVar33,
                           CONCAT16((bVar32 < uStack_3a) * uStack_3a |
                                    (bVar32 >= uStack_3a) * bVar32,
                                    CONCAT15((bVar31 < uStack_3b) * uStack_3b |
                                             (bVar31 >= uStack_3b) * bVar31,
                                             CONCAT14((bVar30 < uStack_3c) * uStack_3c |
                                                      (bVar30 >= uStack_3c) * bVar30,
                                                      CONCAT13((bVar29 < uStack_3d) * uStack_3d |
                                                               (bVar29 >= uStack_3d) * bVar29,
                                                               CONCAT12((bVar28 < uStack_3e) *
                                                                        uStack_3e |
                                                                        (bVar28 >= uStack_3e) *
                                                                        bVar28,CONCAT11((bVar27 < 
                                                  uStack_3f) * uStack_3f |
                                                  (bVar27 >= uStack_3f) * bVar27,
                                                  (bVar26 < uStack_40) * uStack_40 |
                                                  (bVar26 >= uStack_40) * bVar26))))))),
                  CONCAT13((bVar25 < uStack_41) * uStack_41 | (bVar25 >= uStack_41) * bVar25,
                           CONCAT12((bVar24 < uStack_42) * uStack_42 |
                                    (bVar24 >= uStack_42) * bVar24,
                                    CONCAT11((bVar23 < uStack_43) * uStack_43 |
                                             (bVar23 >= uStack_43) * bVar23,
                                             (bVar22 < uStack_44) * uStack_44 |
                                             (bVar22 >= uStack_44) * bVar22))),
                  in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                  in_stack_fffffffffffffd48._8_8_);
    auVar8._8_8_ = in_stack_fffffffffffffc90;
    auVar8._0_8_ = local_378;
    auVar7._8_8_ = in_stack_fffffffffffffca0;
    auVar7._0_8_ = in_stack_fffffffffffffc98;
    psubusb(auVar8,auVar7);
    auVar6._8_8_ = in_stack_fffffffffffffca0;
    auVar6._0_8_ = in_stack_fffffffffffffc98;
    auVar5._8_8_ = in_stack_fffffffffffffc90;
    auVar5._0_8_ = local_378;
    psubusb(auVar6,auVar5);
    auVar4._8_8_ = in_stack_fffffffffffffce0;
    auVar4._0_8_ = in_stack_fffffffffffffcd8;
    auVar3._8_8_ = uStack_310;
    auVar3._0_8_ = in_stack_fffffffffffffce8;
    in_stack_fffffffffffffd48 = psubusb(auVar4,auVar3);
    auVar2._8_8_ = uStack_310;
    auVar2._0_8_ = in_stack_fffffffffffffce8;
    auVar21._8_8_ = in_stack_fffffffffffffce0;
    auVar21._0_8_ = in_stack_fffffffffffffcd8;
    auVar21 = psubusb(auVar2,auVar21);
    stride_00 = (int)in_stack_fffffffffffffce0;
    uStack_1fc = (undefined4)((ulong)in_stack_fffffffffffffce0 >> 0x20);
    auVar1._8_8_ = in_stack_fffffffffffffca0;
    auVar1._0_8_ = in_stack_fffffffffffffc98;
    auVar36._8_4_ = stride_00;
    auVar36._0_8_ = in_stack_fffffffffffffcd8;
    auVar36._12_4_ = uStack_1fc;
    auVar36 = psubusb(auVar1,auVar36);
    auVar34._8_8_ = in_stack_fffffffffffffce0;
    auVar34._0_8_ = in_stack_fffffffffffffcd8;
    auVar20._8_8_ = in_stack_fffffffffffffca0;
    auVar20._0_8_ = in_stack_fffffffffffffc98;
    auVar20 = psubusb(auVar34,auVar20);
    ComplexMask_SSE2(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                     in_stack_fffffffffffffcc0,(int)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                     (int)in_stack_fffffffffffffcb8,auVar35._8_8_);
    DoFilter4_SSE2(auVar21._0_8_,auVar36._8_8_,auVar36._0_8_,auVar20._8_8_,auVar20._0_8_,
                   (int)((ulong)in_RDI >> 0x20));
    Store16x4_SSE2(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                   in_stack_fffffffffffffcd0,(uint8_t *)in_stack_fffffffffffffcc8,
                   (uint8_t *)in_stack_fffffffffffffcc0,stride_00);
    in_stack_fffffffffffffcb8 = local_378;
    in_stack_fffffffffffffcc0 = in_stack_fffffffffffffc90;
    in_stack_fffffffffffffcc8 = in_stack_fffffffffffffc98;
    in_stack_fffffffffffffcd0 = in_stack_fffffffffffffca0;
  }
  return;
}

Assistant:

static void HFilter16i_SSE2(uint8_t* p, int stride,
                            int thresh, int ithresh, int hev_thresh) {
  int k;
  __m128i p3, p2, p1, p0;   // loop invariants

  Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &p1, &p0);  // prologue

  for (k = 3; k > 0; --k) {
    __m128i mask, tmp1, tmp2;
    uint8_t* const b = p + 2;   // beginning of p1

    p += 4;  // beginning of q0 (and next span)

    MAX_DIFF1(p3, p2, p1, p0, mask);   // compute partial mask
    Load16x4_SSE2(p, p + 8 * stride, stride, &p3, &p2, &tmp1, &tmp2);
    MAX_DIFF2(p3, p2, tmp1, tmp2, mask);

    ComplexMask_SSE2(&p1, &p0, &p3, &p2, thresh, ithresh, &mask);
    DoFilter4_SSE2(&p1, &p0, &p3, &p2, &mask, hev_thresh);

    Store16x4_SSE2(&p1, &p0, &p3, &p2, b, b + 8 * stride, stride);

    // rotate samples
    p1 = tmp1;
    p0 = tmp2;
  }
}